

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_bin
          (int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  undefined1 uVar1;
  uint uVar2;
  undefined1 n [16];
  string_view prefix;
  format_specs specs;
  int iVar3;
  long in_RDI;
  string_view sVar4;
  undefined1 in_stack_00000000 [16];
  bin_writer<1> in_stack_00000010;
  int num_digits;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  internal *this_00;
  size_t sVar5;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') {
    uVar2 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x20 + (ulong)uVar2) = 0x30;
    uVar1 = *(undefined1 *)(*(long *)(in_RDI + 8) + 8);
    uVar2 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x20 + (ulong)uVar2) = uVar1;
  }
  this_00 = *(internal **)(in_RDI + 0x10);
  sVar5 = *(size_t *)(in_RDI + 0x18);
  n._8_8_ = in_stack_ffffffffffffff30;
  n._0_8_ = in_stack_ffffffffffffff28;
  iVar3 = count_digits<1u,unsigned__int128>(this_00,(unsigned___int128)n);
  sVar4 = get_prefix((int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *)0x1ccbdf);
  prefix.size_ = sVar5;
  prefix.data_ = (char *)this_00;
  specs.precision = iVar3;
  specs.width = in_stack_fffffffffffffff0;
  specs.type = (char)in_RDI;
  specs._9_3_ = (int3)((ulong)in_RDI >> 8);
  specs.fill.data_[0] = (int)((ulong)in_RDI >> 0x20);
  specs.fill._4_16_ = in_stack_00000000;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)sVar4.size_,sVar4.data_._4_4_,prefix,
             specs,in_stack_00000010);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }